

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

GLenum __thiscall
gl4cts::DirectStateAccess::Textures::CreationErrorsTest::NotATarget(CreationErrorsTest *this)

{
  GLenum GVar1;
  ulong uVar2;
  GLenum GVar3;
  GLenum *pGVar4;
  ulong uVar5;
  bool bVar6;
  
  bVar6 = true;
  GVar3 = 0;
  do {
    if (!bVar6) {
      return GVar3;
    }
    GVar3 = GVar3 + 1;
    pGVar4 = Textures::CreationTest::iterate::texture_targets;
    uVar2 = 0;
    do {
      uVar5 = uVar2;
      if (uVar5 == 0xb) break;
      GVar1 = *pGVar4;
      pGVar4 = pGVar4 + 1;
      uVar2 = uVar5 + 1;
    } while (GVar1 != GVar3);
    bVar6 = uVar5 < 0xb;
  } while( true );
}

Assistant:

glw::GLenum CreationErrorsTest::NotATarget()
{
	static const glw::GLenum texture_targets[] = { GL_TEXTURE_1D,
												   GL_TEXTURE_2D,
												   GL_TEXTURE_3D,
												   GL_TEXTURE_1D_ARRAY,
												   GL_TEXTURE_2D_ARRAY,
												   GL_TEXTURE_RECTANGLE,
												   GL_TEXTURE_CUBE_MAP,
												   GL_TEXTURE_CUBE_MAP_ARRAY,
												   GL_TEXTURE_BUFFER,
												   GL_TEXTURE_2D_MULTISAMPLE,
												   GL_TEXTURE_2D_MULTISAMPLE_ARRAY };

	glw::GLenum not_a_target = 0;
	bool		is_target	= true;

	while (is_target)
	{
		not_a_target++;

		is_target = false;

		for (glw::GLuint i = 0; i < sizeof(texture_targets) / sizeof(texture_targets[0]); ++i)
		{
			if (texture_targets[i] == not_a_target)
			{
				is_target = true;
				break;
			}
		}
	}

	return not_a_target;
}